

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::PrimitiveSetInvarianceCase::init
          (PrimitiveSetInvarianceCase *this,EVP_PKEY_CTX *ctx)

{
  WindingUsage WVar1;
  TessPrimitiveType TVar2;
  SpacingMode primType;
  Winding w;
  Context *pCVar3;
  undefined4 uVar4;
  bool bVar5;
  int extraout_EAX;
  RenderTarget *renderTarget;
  size_type sVar6;
  reference pvVar7;
  ShaderProgram *pSVar8;
  RenderContext *renderCtx;
  Context *pCVar9;
  ProgramSources *pPVar10;
  TestLog *pTVar11;
  reference pvVar12;
  TestError *this_00;
  MessageBuilder *pMVar13;
  char *code;
  int precision;
  undefined1 in_R9B;
  string local_6a8;
  MessageBuilder local_688;
  string local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  string local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  ScopedLogSection local_488;
  ScopedLogSection section;
  TransformFeedbackMode local_478;
  allocator<char> local_471;
  string local_470;
  TransformFeedbackVarying local_450;
  string local_430;
  ShaderSource local_410;
  string local_3e8;
  ShaderSource local_3c8;
  string local_3a0;
  ShaderSource local_380;
  string local_358;
  ShaderSource local_338;
  ProgramSources local_310;
  SharedPtr<const_glu::ShaderProgram> local_240;
  Program local_230;
  allocator<char> local_211;
  string local_210 [8];
  string fragmentShaderTemplate;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  undefined1 local_130 [8];
  string tessellationEvaluationTemplate;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [8];
  string tessellationControlTemplate;
  string local_a0 [8];
  string vertexShaderTemplate;
  undefined1 local_78 [4];
  int programNdx;
  string floatLit01;
  int windingCaseNdx;
  int constantExprCaseNdx;
  value_type local_48 [5];
  value_type local_34;
  undefined1 local_30 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
  windings;
  int numDifferentConstantExprCases;
  PrimitiveSetInvarianceCase *this_local;
  
  windings.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 2;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
  ::vector((vector<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
            *)local_30);
  WVar1 = this->m_windingUsage;
  if (WVar1 == WINDINGUSAGE_CCW) {
    local_34 = WINDING_CCW;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
                 *)local_30,&local_34);
  }
  else if (WVar1 == WINDINGUSAGE_CW) {
    local_48[0] = WINDING_CW;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
                 *)local_30,local_48);
  }
  else if (WVar1 == WINDINGUSAGE_VARY) {
    constantExprCaseNdx = 0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
                 *)local_30,(value_type *)&constantExprCaseNdx);
    windingCaseNdx = 1;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
                 *)local_30,(value_type *)&windingCaseNdx);
  }
  checkTessellationSupport((this->super_TestCase).m_context);
  renderTarget = Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize(renderTarget,0x10);
  floatLit01.field_2._12_4_ = 0;
  do {
    if (1 < (int)floatLit01.field_2._12_4_) {
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
      ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
                 *)local_30);
      return extraout_EAX;
    }
    for (floatLit01.field_2._8_4_ = 0; uVar4 = floatLit01.field_2._8_4_,
        sVar6 = std::
                vector<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
                ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
                        *)local_30), (int)uVar4 < (int)sVar6;
        floatLit01.field_2._8_4_ = floatLit01.field_2._8_4_ + 1) {
      de::floatToString_abi_cxx11_
                ((string *)local_78,(de *)0x2,10.0 / (float)(floatLit01.field_2._12_4_ + 10),
                 precision);
      sVar6 = std::
              vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
              ::size(&this->m_programs);
      vertexShaderTemplate.field_2._12_4_ = (undefined4)sVar6;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_a0,
                 "${GLSL_VERSION_DECL}\n\nin highp float in_v_attr;\nout highp float in_tc_attr;\n\nvoid main (void)\n{\n\tin_tc_attr = in_v_attr;\n}\n"
                 ,(allocator<char> *)(tessellationControlTemplate.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator
                ((allocator<char> *)(tessellationControlTemplate.field_2._M_local_buf + 0xf));
      tessellationEvaluationTemplate.field_2._12_4_ = floatLit01.field_2._12_4_ + 1;
      de::toString<int>(&local_108,
                        (int *)(tessellationEvaluationTemplate.field_2._M_local_buf + 0xc));
      std::operator+(&local_e8,
                     "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices = ",
                     &local_108);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                     &local_e8,
                     ") out;\n\nin highp float in_tc_attr[];\n\npatch out highp float in_te_positionOffset;\n\nvoid main (void)\n{\n\tin_te_positionOffset = in_tc_attr[6];\n\n\tgl_TessLevelInner[0] = in_tc_attr[0];\n\tgl_TessLevelInner[1] = in_tc_attr[1];\n\n\tgl_TessLevelOuter[0] = in_tc_attr[2];\n\tgl_TessLevelOuter[1] = in_tc_attr[3];\n\tgl_TessLevelOuter[2] = in_tc_attr[4];\n\tgl_TessLevelOuter[3] = in_tc_attr[5];\n}\n"
                    );
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_108);
      TVar2 = this->m_primitiveType;
      primType = this->m_spacing;
      pvVar7 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
               ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
                             *)local_30,(long)(int)floatLit01.field_2._8_4_);
      code = (char *)(ulong)*pvVar7;
      (anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
                ((string *)((long)&fragmentShaderTemplate.field_2 + 8),
                 (_anonymous_namespace_ *)(ulong)TVar2,primType,*pvVar7,
                 this->m_usePointMode & WINDING_CW,(bool)in_R9B);
      std::operator+(&local_1d0,"${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\n",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&fragmentShaderTemplate.field_2 + 8));
      std::operator+(&local_1b0,&local_1d0,
                     "\npatch in highp float in_te_positionOffset;\n\nout highp vec4 in_f_color;\ninvariant out highp vec3 out_te_tessCoord;\n\nvoid main (void)\n{\n\tgl_Position = vec4(gl_TessCoord.xy*"
                    );
      std::operator+(&local_190,&local_1b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
      std::operator+(&local_170,&local_190,
                     " - in_te_positionOffset + float(gl_PrimitiveID)*0.1, 0.0, 1.0);\n\tin_f_color = vec4("
                    );
      std::operator+(&local_150,&local_170,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                     &local_150,");\n\tout_te_tessCoord = gl_TessCoord;\n}\n");
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)(fragmentShaderTemplate.field_2._M_local_buf + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_210,
                 "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nin highp vec4 in_f_color;\n\nvoid main (void)\n{\n\to_color = in_f_color;\n}\n"
                 ,&local_211);
      std::allocator<char>::~allocator(&local_211);
      pvVar7 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
               ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
                             *)local_30,(long)(int)floatLit01.field_2._8_4_);
      w = *pvVar7;
      pSVar8 = (ShaderProgram *)operator_new(0xd0);
      section.m_log._7_1_ = 1;
      renderCtx = Context::getRenderContext((this->super_TestCase).m_context);
      glu::ProgramSources::ProgramSources(&local_310);
      pCVar3 = (this->super_TestCase).m_context;
      pCVar9 = (Context *)std::__cxx11::string::c_str();
      (anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_358,(_anonymous_namespace_ *)pCVar3,pCVar9,code);
      glu::VertexSource::VertexSource((VertexSource *)&local_338,&local_358);
      pPVar10 = glu::ProgramSources::operator<<(&local_310,&local_338);
      pCVar3 = (this->super_TestCase).m_context;
      pCVar9 = (Context *)std::__cxx11::string::c_str();
      (anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_3a0,(_anonymous_namespace_ *)pCVar3,pCVar9,code);
      glu::TessellationControlSource::TessellationControlSource
                ((TessellationControlSource *)&local_380,&local_3a0);
      pPVar10 = glu::ProgramSources::operator<<(pPVar10,&local_380);
      pCVar3 = (this->super_TestCase).m_context;
      pCVar9 = (Context *)std::__cxx11::string::c_str();
      (anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_3e8,(_anonymous_namespace_ *)pCVar3,pCVar9,code);
      glu::TessellationEvaluationSource::TessellationEvaluationSource
                ((TessellationEvaluationSource *)&local_3c8,&local_3e8);
      pPVar10 = glu::ProgramSources::operator<<(pPVar10,&local_3c8);
      pCVar3 = (this->super_TestCase).m_context;
      pCVar9 = (Context *)std::__cxx11::string::c_str();
      (anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_430,(_anonymous_namespace_ *)pCVar3,pCVar9,code);
      glu::FragmentSource::FragmentSource((FragmentSource *)&local_410,&local_430);
      pPVar10 = glu::ProgramSources::operator<<(pPVar10,&local_410);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_470,"out_te_tessCoord",&local_471);
      glu::TransformFeedbackVarying::TransformFeedbackVarying(&local_450,&local_470);
      pPVar10 = glu::ProgramSources::operator<<(pPVar10,&local_450);
      glu::TransformFeedbackMode::TransformFeedbackMode(&local_478,0x8c8c);
      pPVar10 = glu::ProgramSources::operator<<(pPVar10,&local_478);
      glu::ShaderProgram::ShaderProgram(pSVar8,renderCtx,pPVar10);
      section.m_log._7_1_ = 0;
      de::SharedPtr<const_glu::ShaderProgram>::SharedPtr(&local_240,pSVar8);
      Program::Program(&local_230,w,&local_240);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
      ::push_back(&this->m_programs,&local_230);
      Program::~Program(&local_230);
      de::SharedPtr<const_glu::ShaderProgram>::~SharedPtr(&local_240);
      glu::TransformFeedbackVarying::~TransformFeedbackVarying(&local_450);
      std::__cxx11::string::~string((string *)&local_470);
      std::allocator<char>::~allocator(&local_471);
      glu::FragmentSource::~FragmentSource((FragmentSource *)&local_410);
      std::__cxx11::string::~string((string *)&local_430);
      glu::TessellationEvaluationSource::~TessellationEvaluationSource
                ((TessellationEvaluationSource *)&local_3c8);
      std::__cxx11::string::~string((string *)&local_3e8);
      glu::TessellationControlSource::~TessellationControlSource
                ((TessellationControlSource *)&local_380);
      std::__cxx11::string::~string((string *)&local_3a0);
      glu::VertexSource::~VertexSource((VertexSource *)&local_338);
      std::__cxx11::string::~string((string *)&local_358);
      glu::ProgramSources::~ProgramSources(&local_310);
      pTVar11 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      de::toString<int>(&local_4c8,(int *)(vertexShaderTemplate.field_2._M_local_buf + 0xc));
      std::operator+(&local_4a8,"Program",&local_4c8);
      de::toString<int>(&local_508,(int *)(vertexShaderTemplate.field_2._M_local_buf + 0xc));
      std::operator+(&local_4e8,"Program ",&local_508);
      tcu::ScopedLogSection::ScopedLogSection(&local_488,pTVar11,&local_4a8,&local_4e8);
      std::__cxx11::string::~string((string *)&local_4e8);
      std::__cxx11::string::~string((string *)&local_508);
      std::__cxx11::string::~string((string *)&local_4a8);
      std::__cxx11::string::~string((string *)&local_4c8);
      if (vertexShaderTemplate.field_2._12_4_ == 0) {
LAB_006a927e:
        pTVar11 = tcu::TestContext::getLog
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        pvVar12 = std::
                  vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
                  ::back(&this->m_programs);
        pSVar8 = de::SharedPtr<const_glu::ShaderProgram>::operator*(&pvVar12->program);
        glu::operator<<(pTVar11,pSVar8);
      }
      else {
        pvVar12 = std::
                  vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
                  ::back(&this->m_programs);
        pSVar8 = de::SharedPtr<const_glu::ShaderProgram>::operator->(&pvVar12->program);
        bVar5 = glu::ShaderProgram::isOk(pSVar8);
        if (!bVar5) goto LAB_006a927e;
      }
      pvVar12 = std::
                vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
                ::back(&this->m_programs);
      pSVar8 = de::SharedPtr<const_glu::ShaderProgram>::operator->(&pvVar12->program);
      bVar5 = glu::ShaderProgram::isOk(pSVar8);
      if (!bVar5) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Program compilation failed",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                   ,0xe80);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      if (0 < (int)vertexShaderTemplate.field_2._12_4_) {
        pTVar11 = tcu::TestContext::getLog
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_688,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar13 = tcu::MessageBuilder::operator<<(&local_688,(char (*) [15])"Note: program ");
        pMVar13 = tcu::MessageBuilder::operator<<
                            (pMVar13,(int *)(vertexShaderTemplate.field_2._M_local_buf + 0xc));
        pMVar13 = tcu::MessageBuilder::operator<<
                            (pMVar13,(char (*) [65])
                                     " is similar to above, except some constants are different, and: "
                            );
        pvVar12 = std::
                  vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
                  ::back(&this->m_programs);
        (anonymous_namespace)::PrimitiveSetInvarianceCase::Program::description_abi_cxx11_
                  (&local_6a8,pvVar12);
        pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,&local_6a8);
        tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_6a8);
        tcu::MessageBuilder::~MessageBuilder(&local_688);
      }
      tcu::ScopedLogSection::~ScopedLogSection(&local_488);
      std::__cxx11::string::~string(local_210);
      std::__cxx11::string::~string((string *)local_130);
      std::__cxx11::string::~string((string *)local_c8);
      std::__cxx11::string::~string(local_a0);
      std::__cxx11::string::~string((string *)local_78);
    }
    floatLit01.field_2._12_4_ = floatLit01.field_2._12_4_ + 1;
  } while( true );
}

Assistant:

void PrimitiveSetInvarianceCase::init (void)
{
	const int			numDifferentConstantExprCases = 2;
	vector<Winding>		windings;
	switch (m_windingUsage)
	{
		case WINDINGUSAGE_CCW:		windings.push_back(WINDING_CCW); break;
		case WINDINGUSAGE_CW:		windings.push_back(WINDING_CW); break;
		case WINDINGUSAGE_VARY:		windings.push_back(WINDING_CCW);
									windings.push_back(WINDING_CW); break;
		default: DE_ASSERT(false);
	}

	checkTessellationSupport(m_context);
	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	for (int constantExprCaseNdx = 0; constantExprCaseNdx < numDifferentConstantExprCases; constantExprCaseNdx++)
	{
		for (int windingCaseNdx = 0; windingCaseNdx < (int)windings.size(); windingCaseNdx++)
		{
			const string	floatLit01 = de::floatToString(10.0f / (float)(constantExprCaseNdx + 10), 2);
			const int		programNdx = (int)m_programs.size();

			std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
															 "\n"
															 "in highp float in_v_attr;\n"
															 "out highp float in_tc_attr;\n"
															 "\n"
															 "void main (void)\n"
															 "{\n"
															 "	in_tc_attr = in_v_attr;\n"
														 "}\n");
			std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
														 "${TESSELLATION_SHADER_REQUIRE}\n"
															 "\n"
															 "layout (vertices = " + de::toString(constantExprCaseNdx+1) + ") out;\n"
															 "\n"
															 "in highp float in_tc_attr[];\n"
															 "\n"
															 "patch out highp float in_te_positionOffset;\n"
															 "\n"
															 "void main (void)\n"
															 "{\n"
															 "	in_te_positionOffset = in_tc_attr[6];\n"
															 "\n"
															 "	gl_TessLevelInner[0] = in_tc_attr[0];\n"
															 "	gl_TessLevelInner[1] = in_tc_attr[1];\n"
															 "\n"
															 "	gl_TessLevelOuter[0] = in_tc_attr[2];\n"
															 "	gl_TessLevelOuter[1] = in_tc_attr[3];\n"
															 "	gl_TessLevelOuter[2] = in_tc_attr[4];\n"
															 "	gl_TessLevelOuter[3] = in_tc_attr[5];\n"
														 "}\n");
			std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
														 "${TESSELLATION_SHADER_REQUIRE}\n"
															 "\n"
															 + getTessellationEvaluationInLayoutString(m_primitiveType, m_spacing, windings[windingCaseNdx], m_usePointMode) +
															 "\n"
															 "patch in highp float in_te_positionOffset;\n"
															 "\n"
															 "out highp vec4 in_f_color;\n"
															 "invariant out highp vec3 out_te_tessCoord;\n"
															 "\n"
															 "void main (void)\n"
															 "{\n"
															 "	gl_Position = vec4(gl_TessCoord.xy*" + floatLit01 + " - in_te_positionOffset + float(gl_PrimitiveID)*0.1, 0.0, 1.0);\n"
															 "	in_f_color = vec4(" + floatLit01 + ");\n"
															 "	out_te_tessCoord = gl_TessCoord;\n"
														 "}\n");
			std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
															 "\n"
															 "layout (location = 0) out mediump vec4 o_color;\n"
															 "\n"
															 "in highp vec4 in_f_color;\n"
															 "\n"
															 "void main (void)\n"
															 "{\n"
															 "	o_color = in_f_color;\n"
														 "}\n");

			m_programs.push_back(Program(windings[windingCaseNdx],
										 SharedPtr<const ShaderProgram>(new ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
					<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
					<< glu::TessellationControlSource		(specializeShader(m_context, tessellationControlTemplate.c_str()))
					<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
					<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()))
					<< glu::TransformFeedbackVarying		("out_te_tessCoord")
					<< glu::TransformFeedbackMode			(GL_INTERLEAVED_ATTRIBS)))));

			{
				const tcu::ScopedLogSection section(m_testCtx.getLog(), "Program" + de::toString(programNdx), "Program " + de::toString(programNdx));

				if (programNdx == 0 || !m_programs.back().program->isOk())
					m_testCtx.getLog() << *m_programs.back().program;

				if (!m_programs.back().program->isOk())
					TCU_FAIL("Program compilation failed");

				if (programNdx > 0)
					m_testCtx.getLog() << TestLog::Message << "Note: program " << programNdx << " is similar to above, except some constants are different, and: " << m_programs.back().description() << TestLog::EndMessage;
			}
		}
	}
}